

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createTextureCall
          (Builder *this,Decoration precision,Id resultType,bool sparse,bool fetch,bool proj,
          bool gather,bool noImplicitLod,TextureParameters *parameters)

{
  Block *this_00;
  bool bVar1;
  Id IVar2;
  Instruction *this_01;
  size_t size;
  Id local_94;
  Id resultId;
  Op local_84;
  int local_80;
  int op_1;
  int op;
  Instruction *local_70;
  Instruction *textureInst;
  Id typeId1;
  Id typeId0;
  Id smearedType;
  Op opCode;
  ImageOperandsMask mask;
  int optArgNum;
  Id local_48;
  bool explicitLod;
  int numArgs;
  Id texArgs [10];
  Id IStack_18;
  bool noImplicitLod_local;
  bool gather_local;
  bool proj_local;
  bool fetch_local;
  bool sparse_local;
  Id resultType_local;
  Decoration precision_local;
  Builder *this_local;
  
  texArgs[9]._0_1_ = gather;
  texArgs[8]._3_1_ = noImplicitLod;
  texArgs[9]._1_1_ = proj;
  texArgs[9]._2_1_ = fetch;
  texArgs[9]._3_1_ = sparse;
  memset(&stack0xffffffffffffffb8,0,0x28);
  mask._3_1_ = ImageOperandsMaskNone >> 0x18;
  local_48 = parameters->sampler;
  numArgs = parameters->coords;
  optArgNum = 2;
  if (parameters->Dref != 0) {
    texArgs[0] = parameters->Dref;
    optArgNum = 3;
  }
  if (parameters->component != 0) {
    texArgs[(long)optArgNum + -2] = parameters->component;
    optArgNum = optArgNum + 1;
  }
  opCode = optArgNum;
  optArgNum = optArgNum + 1;
  smearedType = 0;
  if (parameters->bias != 0) {
    smearedType = operator|(ImageOperandsMaskNone,ImageOperandsBiasMask);
    texArgs[(long)optArgNum + -2] = parameters->bias;
    optArgNum = optArgNum + 1;
  }
  if (parameters->lod == 0) {
    if (parameters->gradX == 0) {
      if ((((texArgs[8]._3_1_ & 1) != 0) && ((texArgs[9]._2_1_ & 1) == 0)) &&
         (((byte)texArgs[9] & 1) == 0)) {
        smearedType = operator|(smearedType,ImageOperandsLodMask);
        IVar2 = makeFloatConstant(this,0.0,false);
        texArgs[(long)optArgNum + -2] = IVar2;
        mask._3_1_ = 1;
        optArgNum = optArgNum + 1;
      }
    }
    else {
      smearedType = operator|(smearedType,ImageOperandsGradMask);
      texArgs[(long)optArgNum + -2] = parameters->gradX;
      texArgs[(long)(optArgNum + 1) + -2] = parameters->gradY;
      mask._3_1_ = 1;
      optArgNum = optArgNum + 2;
    }
  }
  else {
    smearedType = operator|(smearedType,ImageOperandsLodMask);
    texArgs[(long)optArgNum + -2] = parameters->lod;
    mask._3_1_ = 1;
    optArgNum = optArgNum + 1;
  }
  if (parameters->offset != 0) {
    bVar1 = isConstant(this,parameters->offset);
    if (bVar1) {
      smearedType = operator|(smearedType,ImageOperandsConstOffsetMask);
    }
    else {
      addCapability(this,CapabilityImageGatherExtended);
      smearedType = operator|(smearedType,ImageOperandsOffsetMask);
    }
    texArgs[(long)optArgNum + -2] = parameters->offset;
    optArgNum = optArgNum + 1;
  }
  if (parameters->offsets != 0) {
    smearedType = operator|(smearedType,ImageOperandsConstOffsetsMask);
    texArgs[(long)optArgNum + -2] = parameters->offsets;
    optArgNum = optArgNum + 1;
  }
  if (parameters->sample != 0) {
    smearedType = operator|(smearedType,ImageOperandsSampleMask);
    texArgs[(long)optArgNum + -2] = parameters->sample;
    optArgNum = optArgNum + 1;
  }
  if (parameters->lodClamp != 0) {
    addCapability(this,CapabilityMinLod);
    smearedType = operator|(smearedType,ImageOperandsMinLodMask);
    texArgs[(long)optArgNum + -2] = parameters->lodClamp;
    optArgNum = optArgNum + 1;
  }
  if (smearedType == 0) {
    optArgNum = optArgNum + -1;
  }
  else {
    texArgs[(long)(int)opCode + -2] = smearedType;
  }
  if ((texArgs[9]._2_1_ & 1) == 0) {
    if (((byte)texArgs[9] & 1) == 0) {
      if ((mask._3_1_ & 1) == ImageOperandsMaskNone >> 0x18) {
        if (parameters->Dref == 0) {
          if ((texArgs[9]._1_1_ & 1) == 0) {
            if ((texArgs[9]._3_1_ & 1) == 0) {
              typeId0 = 0x57;
            }
            else {
              typeId0 = 0x131;
            }
          }
          else if ((texArgs[9]._3_1_ & 1) == 0) {
            typeId0 = 0x5b;
          }
          else {
            typeId0 = 0x135;
          }
        }
        else if ((texArgs[9]._1_1_ & 1) == 0) {
          if ((texArgs[9]._3_1_ & 1) == 0) {
            typeId0 = 0x59;
          }
          else {
            typeId0 = 0x133;
          }
        }
        else if ((texArgs[9]._3_1_ & 1) == 0) {
          typeId0 = 0x5d;
        }
        else {
          typeId0 = 0x137;
        }
      }
      else if (parameters->Dref == 0) {
        if ((texArgs[9]._1_1_ & 1) == 0) {
          if ((texArgs[9]._3_1_ & 1) == 0) {
            typeId0 = 0x58;
          }
          else {
            typeId0 = 0x132;
          }
        }
        else if ((texArgs[9]._3_1_ & 1) == 0) {
          typeId0 = 0x5c;
        }
        else {
          typeId0 = 0x136;
        }
      }
      else if ((texArgs[9]._1_1_ & 1) == 0) {
        if ((texArgs[9]._3_1_ & 1) == 0) {
          typeId0 = 0x5a;
        }
        else {
          typeId0 = 0x134;
        }
      }
      else if ((texArgs[9]._3_1_ & 1) == 0) {
        typeId0 = 0x5e;
      }
      else {
        typeId0 = 0x138;
      }
    }
    else if (parameters->Dref == 0) {
      if ((texArgs[9]._3_1_ & 1) == 0) {
        typeId0 = 0x60;
      }
      else {
        typeId0 = 0x13a;
      }
    }
    else if ((texArgs[9]._3_1_ & 1) == 0) {
      typeId0 = 0x61;
    }
    else {
      typeId0 = 0x13b;
    }
  }
  else if ((texArgs[9]._3_1_ & 1) == 0) {
    typeId0 = 0x5f;
  }
  else {
    typeId0 = 0x139;
  }
  size = (size_t)resultType;
  typeId1 = resultType;
  bVar1 = isScalarType(this,resultType);
  IStack_18 = resultType;
  if ((!bVar1) && ((typeId0 - 0x59 < 2 || (typeId0 == 0x5d || typeId0 == 0x5e)))) {
    size = (size_t)resultType;
    IStack_18 = getScalarTypeId(this,resultType);
  }
  textureInst._4_4_ = 0;
  textureInst._0_4_ = 0;
  if ((texArgs[9]._3_1_ & 1) != 0) {
    textureInst._4_4_ = IStack_18;
    textureInst._0_4_ = getDerefTypeId(this,parameters->texelOut);
    size = (size_t)textureInst._4_4_;
    IStack_18 = makeStructResultType(this,textureInst._4_4_,(Id)textureInst);
  }
  this_01 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
  IVar2 = getUniqueId(this);
  Instruction::Instruction(this_01,IVar2,IStack_18,typeId0);
  local_70 = this_01;
  for (local_80 = 0; local_80 < (int)opCode; local_80 = local_80 + 1) {
    Instruction::addIdOperand(local_70,texArgs[(long)local_80 + -2]);
  }
  local_84 = opCode;
  if ((int)opCode < optArgNum) {
    Instruction::addImmediateOperand(local_70,texArgs[(long)(int)opCode + -2]);
    local_84 = opCode;
  }
  while (local_84 = local_84 + OpUndef, (int)local_84 < optArgNum) {
    Instruction::addIdOperand(local_70,texArgs[(long)(int)local_84 + -2]);
  }
  IVar2 = Instruction::getResultId(local_70);
  setPrecision(this,IVar2,precision);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
             &stack0xffffffffffffff70,local_70);
  Block::addInstruction
            (this_00,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &stack0xffffffffffffff70);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
            ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
             &stack0xffffffffffffff70);
  local_94 = Instruction::getResultId(local_70);
  if ((texArgs[9]._3_1_ & 1) == 0) {
    if (IStack_18 != typeId1) {
      local_94 = smearScalar(this,precision,local_94,typeId1);
    }
  }
  else {
    addCapability(this,CapabilitySparseResidency);
    IVar2 = createCompositeExtract(this,local_94,(Id)textureInst,1);
    createStore(this,IVar2,parameters->texelOut);
    local_94 = createCompositeExtract(this,local_94,textureInst._4_4_,0);
    setPrecision(this,local_94,precision);
  }
  return local_94;
}

Assistant:

Id Builder::createTextureCall(Decoration precision, Id resultType, bool sparse, bool fetch, bool proj, bool gather, bool noImplicitLod, const TextureParameters& parameters)
{
    static const int maxTextureArgs = 10;
    Id texArgs[maxTextureArgs] = {};

    //
    // Set up the fixed arguments
    //
    int numArgs = 0;
    bool explicitLod = false;
    texArgs[numArgs++] = parameters.sampler;
    texArgs[numArgs++] = parameters.coords;
    if (parameters.Dref != NoResult)
        texArgs[numArgs++] = parameters.Dref;
    if (parameters.component != NoResult)
        texArgs[numArgs++] = parameters.component;

    //
    // Set up the optional arguments
    //
    int optArgNum = numArgs;                        // track which operand, if it exists, is the mask of optional arguments
    ++numArgs;                                      // speculatively make room for the mask operand
    ImageOperandsMask mask = ImageOperandsMaskNone; // the mask operand
    if (parameters.bias) {
        mask = (ImageOperandsMask)(mask | ImageOperandsBiasMask);
        texArgs[numArgs++] = parameters.bias;
    }
    if (parameters.lod) {
        mask = (ImageOperandsMask)(mask | ImageOperandsLodMask);
        texArgs[numArgs++] = parameters.lod;
        explicitLod = true;
    } else if (parameters.gradX) {
        mask = (ImageOperandsMask)(mask | ImageOperandsGradMask);
        texArgs[numArgs++] = parameters.gradX;
        texArgs[numArgs++] = parameters.gradY;
        explicitLod = true;
    } else if (noImplicitLod && ! fetch && ! gather) {
        // have to explicitly use lod of 0 if not allowed to have them be implicit, and
        // we would otherwise be about to issue an implicit instruction
        mask = (ImageOperandsMask)(mask | ImageOperandsLodMask);
        texArgs[numArgs++] = makeFloatConstant(0.0);
        explicitLod = true;
    }
    if (parameters.offset) {
        if (isConstant(parameters.offset))
            mask = (ImageOperandsMask)(mask | ImageOperandsConstOffsetMask);
        else {
            addCapability(CapabilityImageGatherExtended);
            mask = (ImageOperandsMask)(mask | ImageOperandsOffsetMask);
        }
        texArgs[numArgs++] = parameters.offset;
    }
    if (parameters.offsets) {
        mask = (ImageOperandsMask)(mask | ImageOperandsConstOffsetsMask);
        texArgs[numArgs++] = parameters.offsets;
    }
    if (parameters.sample) {
        mask = (ImageOperandsMask)(mask | ImageOperandsSampleMask);
        texArgs[numArgs++] = parameters.sample;
    }
    if (parameters.lodClamp) {
        // capability if this bit is used
        addCapability(CapabilityMinLod);

        mask = (ImageOperandsMask)(mask | ImageOperandsMinLodMask);
        texArgs[numArgs++] = parameters.lodClamp;
    }
    if (mask == ImageOperandsMaskNone)
        --numArgs;  // undo speculative reservation for the mask argument
    else
        texArgs[optArgNum] = mask;

    //
    // Set up the instruction
    //
    Op opCode = OpNop;  // All paths below need to set this
    if (fetch) {
        if (sparse)
            opCode = OpImageSparseFetch;
        else
            opCode = OpImageFetch;
    } else if (gather) {
        if (parameters.Dref)
            if (sparse)
                opCode = OpImageSparseDrefGather;
            else
                opCode = OpImageDrefGather;
        else
            if (sparse)
                opCode = OpImageSparseGather;
            else
                opCode = OpImageGather;
    } else if (explicitLod) {
        if (parameters.Dref) {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjDrefExplicitLod;
                else
                    opCode = OpImageSampleProjDrefExplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleDrefExplicitLod;
                else
                    opCode = OpImageSampleDrefExplicitLod;
        } else {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjExplicitLod;
                else
                    opCode = OpImageSampleProjExplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleExplicitLod;
                else
                    opCode = OpImageSampleExplicitLod;
        }
    } else {
        if (parameters.Dref) {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjDrefImplicitLod;
                else
                    opCode = OpImageSampleProjDrefImplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleDrefImplicitLod;
                else
                    opCode = OpImageSampleDrefImplicitLod;
        } else {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjImplicitLod;
                else
                    opCode = OpImageSampleProjImplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleImplicitLod;
                else
                    opCode = OpImageSampleImplicitLod;
        }
    }

    // See if the result type is expecting a smeared result.
    // This happens when a legacy shadow*() call is made, which
    // gets a vec4 back instead of a float.
    Id smearedType = resultType;
    if (! isScalarType(resultType)) {
        switch (opCode) {
        case OpImageSampleDrefImplicitLod:
        case OpImageSampleDrefExplicitLod:
        case OpImageSampleProjDrefImplicitLod:
        case OpImageSampleProjDrefExplicitLod:
            resultType = getScalarTypeId(resultType);
            break;
        default:
            break;
        }
    }

    Id typeId0 = 0;
    Id typeId1 = 0;

    if (sparse) {
        typeId0 = resultType;
        typeId1 = getDerefTypeId(parameters.texelOut);
        resultType = makeStructResultType(typeId0, typeId1);
    }

    // Build the SPIR-V instruction
    Instruction* textureInst = new Instruction(getUniqueId(), resultType, opCode);
    for (int op = 0; op < optArgNum; ++op)
        textureInst->addIdOperand(texArgs[op]);
    if (optArgNum < numArgs)
        textureInst->addImmediateOperand(texArgs[optArgNum]);
    for (int op = optArgNum + 1; op < numArgs; ++op)
        textureInst->addIdOperand(texArgs[op]);
    setPrecision(textureInst->getResultId(), precision);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(textureInst));

    Id resultId = textureInst->getResultId();

    if (sparse) {
        // set capability
        addCapability(CapabilitySparseResidency);

        // Decode the return type that was a special structure
        createStore(createCompositeExtract(resultId, typeId1, 1), parameters.texelOut);
        resultId = createCompositeExtract(resultId, typeId0, 0);
        setPrecision(resultId, precision);
    } else {
        // When a smear is needed, do it, as per what was computed
        // above when resultType was changed to a scalar type.
        if (resultType != smearedType)
            resultId = smearScalar(precision, resultId, smearedType);
    }

    return resultId;
}